

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeNext(BtCursor *pCur,int *pRes)

{
  char cVar1;
  u8 uVar2;
  u16 uVar3;
  uint uVar4;
  MemPage *pMVar5;
  int iVar6;
  long lVar7;
  ushort uVar8;
  
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  *pRes = 0;
  if (pCur->eState == '\x01') {
    cVar1 = pCur->iPage;
    pMVar5 = pCur->apPage[cVar1];
    uVar3 = pCur->aiIdx[cVar1];
    uVar8 = uVar3 + 1;
    pCur->aiIdx[cVar1] = uVar8;
    if (pMVar5->nCell <= uVar8) {
      pCur->aiIdx[cVar1] = uVar3;
      iVar6 = btreeNext(pCur,pRes);
      return iVar6;
    }
    if (pMVar5->leaf != '\0') {
      return 0;
    }
    lVar7 = (long)pCur->iPage;
    pMVar5 = pCur->apPage[lVar7];
    uVar2 = pMVar5->leaf;
    while( true ) {
      if (uVar2 != '\0') {
        return 0;
      }
      uVar4 = *(uint *)(pMVar5->aData +
                       (CONCAT11(pMVar5->aCellIdx[(ulong)pCur->aiIdx[lVar7] * 2],
                                 pMVar5->aCellIdx[(ulong)pCur->aiIdx[lVar7] * 2 + 1]) &
                       pMVar5->maskPage));
      iVar6 = moveToChild(pCur,uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                               uVar4 << 0x18);
      if (iVar6 != 0) break;
      lVar7 = (long)pCur->iPage;
      pMVar5 = pCur->apPage[lVar7];
      uVar2 = pMVar5->leaf;
    }
    return iVar6;
  }
  if (pCur->eState != 1) {
    iVar6 = 0;
    if (2 < pCur->eState) {
      iVar6 = btreeRestoreCursorPosition(pCur);
    }
    if (iVar6 != 0) {
      return iVar6;
    }
    if (pCur->eState == '\0') {
      *pRes = 1;
      return 0;
    }
    iVar6 = pCur->skipNext;
    if (iVar6 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (0 < iVar6) {
        return 0;
      }
    }
  }
  cVar1 = pCur->iPage;
  pMVar5 = pCur->apPage[cVar1];
  uVar8 = pCur->aiIdx[cVar1] + 1;
  pCur->aiIdx[cVar1] = uVar8;
  if (uVar8 < pMVar5->nCell) {
    if (pMVar5->leaf == '\0') {
LAB_00139cc9:
      iVar6 = moveToLeftmost(pCur);
      return iVar6;
    }
  }
  else {
    if (pMVar5->leaf == '\0') {
      uVar4 = *(uint *)(pMVar5->aData + (ulong)pMVar5->hdrOffset + 8);
      iVar6 = moveToChild(pCur,uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                               uVar4 << 0x18);
      if (iVar6 != 0) {
        return iVar6;
      }
      goto LAB_00139cc9;
    }
    do {
      cVar1 = pCur->iPage;
      if ((long)cVar1 == 0) {
        *pRes = 1;
        pCur->eState = '\0';
        return 0;
      }
      (pCur->info).nSize = 0;
      pCur->curFlags = pCur->curFlags & 0xf9;
      pCur->iPage = cVar1 + -1;
      sqlite3PagerUnrefNotNull(pCur->apPage[cVar1]->pDbPage);
    } while (pCur->apPage[pCur->iPage]->nCell <= pCur->aiIdx[pCur->iPage]);
    if (pCur->apPage[pCur->iPage]->intKey != '\0') {
      iVar6 = sqlite3BtreeNext(pCur,pRes);
      return iVar6;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int *pRes){
  MemPage *pPage;
  assert( cursorOwnsBtShared(pCur) );
  assert( pRes!=0 );
  assert( *pRes==0 || *pRes==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  *pRes = 0;
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur, pRes);
  pPage = pCur->apPage[pCur->iPage];
  if( (++pCur->aiIdx[pCur->iPage])>=pPage->nCell ){
    pCur->aiIdx[pCur->iPage]--;
    return btreeNext(pCur, pRes);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}